

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_39(QPDF *pdf,char *arg2)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  allocator<char> local_191;
  string local_190 [32];
  QPDFObjectHandle local_170;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [32];
  QPDFObjectHandle local_118;
  string local_108 [32];
  undefined1 local_e8 [8];
  QPDFObjectHandle image_dict;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *i_iter;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  images;
  QPDFPageObjectHelper *page;
  iterator __end1;
  iterator __begin1;
  QPDFPageDocumentHelper local_60;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_40 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_28;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  char *pcStack_18;
  int pageno;
  char *arg2_local;
  QPDF *pdf_local;
  
  __range1._4_4_ = 0;
  pcStack_18 = arg2;
  arg2_local = (char *)pdf;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_60,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_60);
  local_28 = local_40;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_28)
  ;
  page = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&page);
    if (!bVar1) break;
    images._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                 ::operator*(&__end1);
    poVar2 = std::operator<<((ostream *)&std::cout,"page ");
    __range1._4_4_ = __range1._4_4_ + 1;
    this = (void *)std::ostream::operator<<(poVar2,__range1._4_4_);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    QPDFPageObjectHelper::getImages_abi_cxx11_();
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                      *)&__range2);
    i_iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                       *)&__range2);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&i_iter);
      if (!bVar1) break;
      image_dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
           ::operator*(&__end2);
      QPDFObjectHandle::getDict();
      poVar2 = std::operator<<((ostream *)&std::cout,"filter: ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_138,"/Filter",&local_139);
      QPDFObjectHandle::getKey((string *)&local_118);
      QPDFObjectHandle::unparseResolved_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,local_108);
      poVar2 = std::operator<<(poVar2,", color space: ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_190,"/ColorSpace",&local_191);
      QPDFObjectHandle::getKey((string *)&local_170);
      QPDFObjectHandle::unparseResolved_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,local_160);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_160);
      QPDFObjectHandle::~QPDFObjectHandle(&local_170);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_191);
      std::__cxx11::string::~string(local_108);
      QPDFObjectHandle::~QPDFObjectHandle(&local_118);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            *)&__range2);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_40);
  return;
}

Assistant:

static void
test_39(QPDF& pdf, char const* arg2)
{
    // Display image filter and color set for each image on each page
    int pageno = 0;
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        std::cout << "page " << ++pageno << std::endl;
        std::map<std::string, QPDFObjectHandle> images = page.getImages();
        for (auto& i_iter: images) {
            QPDFObjectHandle image_dict = i_iter.second.getDict();
            std::cout << "filter: " << image_dict.getKey("/Filter").unparseResolved()
                      << ", color space: " << image_dict.getKey("/ColorSpace").unparseResolved()
                      << std::endl;
        }
    }
}